

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformBuffer::~RenderFragmentUniformBuffer
          (RenderFragmentUniformBuffer *this)

{
  ~RenderFragmentUniformBuffer(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

RenderFragmentUniformBuffer::~RenderFragmentUniformBuffer (void)
{
}